

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::store_op_is_supported(Impl *this,VkAttachmentStoreOp store_op)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  bool local_c9;
  allocator local_b9;
  string local_b8 [37];
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [37];
  byte local_43;
  byte local_42;
  allocator local_41;
  string local_40 [36];
  VkAttachmentStoreOp local_1c;
  Impl *pIStack_18;
  VkAttachmentStoreOp store_op_local;
  Impl *this_local;
  
  if (store_op < 2) {
    this_local._7_1_ = 1;
  }
  else if (store_op == VK_ATTACHMENT_STORE_OP_NONE) {
    local_42 = 0;
    local_43 = 0;
    local_6a = 0;
    local_6b = 0;
    local_92 = 0;
    local_93 = 0;
    bVar2 = false;
    bVar1 = false;
    local_c9 = true;
    local_1c = store_op;
    pIStack_18 = this;
    if (this->api_version < 0x403000) {
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string(local_40,"VK_KHR_dynamic_rendering",&local_41);
      local_43 = 1;
      sVar3 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_40);
      local_c9 = true;
      if (sVar3 == 0) {
        std::allocator<char>::allocator();
        local_6a = 1;
        std::__cxx11::string::string(local_68,"VK_EXT_load_store_op_none",&local_69);
        local_6b = 1;
        sVar3 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_68);
        local_c9 = true;
        if (sVar3 == 0) {
          std::allocator<char>::allocator();
          local_92 = 1;
          std::__cxx11::string::string(local_90,"VK_KHR_load_store_op_none",&local_91);
          local_93 = 1;
          sVar3 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->enabled_extensions,(key_type *)local_90);
          local_c9 = true;
          if (sVar3 == 0) {
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string(local_b8,"VK_QCOM_render_pass_store_ops",&local_b9);
            bVar1 = true;
            sVar3 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this->enabled_extensions,(key_type *)local_b8);
            local_c9 = sVar3 != 0;
          }
        }
      }
    }
    this_local._7_1_ = local_c9;
    if (bVar1) {
      std::__cxx11::string::~string(local_b8);
    }
    if (bVar2) {
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    if ((local_93 & 1) != 0) {
      std::__cxx11::string::~string(local_90);
    }
    if ((local_92 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    if ((local_6b & 1) != 0) {
      std::__cxx11::string::~string(local_68);
    }
    if ((local_6a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    if ((local_43 & 1) != 0) {
      std::__cxx11::string::~string(local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FeatureFilter::Impl::store_op_is_supported(VkAttachmentStoreOp store_op) const
{
	switch (store_op)
	{
	case VK_ATTACHMENT_STORE_OP_DONT_CARE:
	case VK_ATTACHMENT_STORE_OP_STORE:
		return true;
	case VK_ATTACHMENT_STORE_OP_NONE_KHR:
		return api_version >= VK_API_VERSION_1_3 ||
		       enabled_extensions.count(VK_KHR_DYNAMIC_RENDERING_EXTENSION_NAME) != 0 ||
		       enabled_extensions.count(VK_EXT_LOAD_STORE_OP_NONE_EXTENSION_NAME) != 0 ||
		       enabled_extensions.count(VK_KHR_LOAD_STORE_OP_NONE_EXTENSION_NAME) != 0 ||
		       enabled_extensions.count(VK_QCOM_RENDER_PASS_STORE_OPS_EXTENSION_NAME) != 0;
	default:
		return false;
	}
}